

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashMap_StandardLayout_Test::TestBody
          (ParallelFlatHashMap_StandardLayout_Test *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t new_capacity;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_00;
  size_t sz;
  long lVar5;
  ThisMap<Int,_Int,_Hash> m;
  Int local_370;
  key_arg<Int> local_368;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>::iterator,_bool>
  local_360;
  parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  local_328;
  
  lVar3 = 0;
  do {
    *(undefined1 **)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.ctrl_ + lVar3) =
         EmptyGroup<std::is_same<std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>>()
         ::empty_group;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.settings_ + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.slots_ + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.size_ + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.capacity_ + lVar3) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x300);
  local_368.value = 1;
  local_370.value = 2;
  parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  ::try_emplace<Int,_Int,_0,_nullptr>(&local_360,&local_328,&local_368,&local_370);
  local_368.value = 3;
  local_370.value = 4;
  parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  ::try_emplace<Int,_Int,_0,_nullptr>(&local_360,&local_328,&local_368,&local_370);
  local_360.first.inner_ = (Inner *)0x1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
  ::
  erase<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
              *)&local_328,(key_arg<Int> *)&local_360);
  lVar3 = 0x18;
  lVar5 = 0;
  do {
    lVar5 = lVar5 + *(long *)((long)&local_328.
                                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                                     .sets_._M_elems[0].set_.ctrl_ + lVar3);
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x318);
  uVar2 = lVar5 * 2;
  lVar3 = 0;
  do {
    uVar1 = *(ulong *)((long)&local_328.
                              super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                              .sets_._M_elems[0].set_.capacity_ + lVar3);
    if ((0xf < uVar2) || (uVar1 != 0)) {
      this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                 *)((long)&local_328.
                           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                           .sets_._M_elems[0].set_.ctrl_ + lVar3);
      uVar4 = *(ulong *)((long)&local_328.
                                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                                .sets_._M_elems[0].set_.size_ + lVar3);
      if ((uVar2 < 0x10) && (uVar4 == 0)) {
        raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
        ::destroy_slots(this_00);
      }
      else {
        if (uVar4 <= uVar2 >> 4) {
          uVar4 = uVar2 >> 4;
        }
        lVar5 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        new_capacity = 0xffffffffffffffff >> (~(byte)lVar5 & 0x3f);
        if (uVar4 == 0) {
          new_capacity = 1;
        }
        if ((uVar2 < 0x10) || (uVar1 < new_capacity)) {
          raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
          ::resize(this_00,new_capacity);
        }
      }
    }
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x300);
  lVar3 = 0x2d0;
  do {
    raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
    ::destroy_slots((raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                     *)((long)&local_328.
                               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                               .sets_._M_elems[0].set_.ctrl_ + lVar3));
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x30);
  lVar3 = 0;
  do {
    *(undefined1 **)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.ctrl_ + lVar3) =
         EmptyGroup<std::is_same<std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>>()
         ::empty_group;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.settings_ + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.slots_ + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.size_ + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_328.
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             .sets_._M_elems[0].set_.capacity_ + lVar3) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x300);
  local_368.value = 1;
  local_370.value = 2;
  parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  ::try_emplace<Int,_Int,_0,_nullptr>(&local_360,&local_328,&local_368,&local_370);
  local_368.value = 3;
  local_370.value = 4;
  parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  ::try_emplace<Int,_Int,_0,_nullptr>(&local_360,&local_328,&local_368,&local_370);
  local_360.first.inner_ = (Inner *)0x1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
  ::
  erase<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
              *)&local_328,(key_arg<Int> *)&local_360);
  lVar3 = 0;
  do {
    if (*(long *)((long)&local_328.
                         super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                         .sets_._M_elems[0].set_.size_ + lVar3) != 0) {
      lVar5 = *(long *)((long)&local_328.
                               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                               .sets_._M_elems[0].set_.capacity_ + lVar3);
      if (lVar5 != 0) {
        *(undefined8 *)
         ((long)&local_328.
                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                 .sets_._M_elems[0].set_.size_ + lVar3) = 0;
        memset(*(void **)((long)&local_328.
                                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                                 .sets_._M_elems[0].set_.ctrl_ + lVar3),0x80,lVar5 + 0x10);
        *(undefined1 *)
         (*(long *)((long)&local_328.
                           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                           .sets_._M_elems[0].set_.ctrl_ + lVar3) + lVar5) = 0xff;
        raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
        ::reset_growth_left((raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                             *)((long)&local_328.
                                       super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                                       .sets_._M_elems[0].set_.ctrl_ + lVar3),
                            *(size_t *)
                             ((long)&local_328.
                                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                                     .sets_._M_elems[0].set_.capacity_ + lVar3));
      }
      if (*(long *)((long)&local_328.
                           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                           .sets_._M_elems[0].set_.size_ + lVar3) != 0) {
        __assert_fail("empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x50a,
                      "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
                     );
      }
    }
    lVar3 = lVar3 + 0x30;
    if (lVar3 == 0x300) {
      lVar3 = 0x2d0;
      do {
        raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
        ::destroy_slots((raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                         *)((long)&local_328.
                                   super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                                   .sets_._M_elems[0].set_.ctrl_ + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != -0x30);
      return;
    }
  } while( true );
}

Assistant:

TEST(THIS_TEST_NAME, StandardLayout) {
  struct Int {
    explicit Int(size_t val) : value(val) {}
    Int() : value(0) { ADD_FAILURE(); }
    Int(const Int& other) : value(other.value) { ADD_FAILURE(); }
    Int(Int&&) = default;
    bool operator==(const Int& other) const { return value == other.value; }
    size_t value;
  };
  static_assert(std::is_standard_layout<Int>(), "");

  struct Hash {
    size_t operator()(const Int& obj) const { return obj.value; }
  };

  // Verify that neither the key nor the value get default-constructed or
  // copy-constructed.
  {
    ThisMap<Int, Int, Hash> m;
    m.try_emplace(Int(1), Int(2));
    m.try_emplace(Int(3), Int(4));
    m.erase(Int(1));
    m.rehash(2 * m.bucket_count());
  }
  {
    ThisMap<Int, Int, Hash> m;
    m.try_emplace(Int(1), Int(2));
    m.try_emplace(Int(3), Int(4));
    m.erase(Int(1));
    m.clear();
  }
}